

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijectionmap.h
# Opt level: O1

iterator __thiscall
Common::
BijectionMap<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::insert(BijectionMap<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,Instruction *key,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  map<ICM::Instruction::Instruction,_unsigned_long,_std::less<ICM::Instruction::Instruction>,_std::allocator<std::pair<const_ICM::Instruction::Instruction,_unsigned_long>_>_>
  *map;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  pointer ppVar1;
  pointer pcVar2;
  size_t sVar3;
  const_iterator cVar4;
  long lVar5;
  mapped_type *pmVar6;
  mapped_type mVar7;
  iterator iVar8;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  map = &this->keymap;
  sVar3 = _find<ICM::Instruction::Instruction>(this,map,key);
  if (sVar3 == ((long)(this->data).
                      super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->data).
                      super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) {
    this_00 = &this->valmap;
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::find(&this_00->_M_t,val);
    if ((_Rb_tree_header *)cVar4._M_node == &(this->valmap)._M_t._M_impl.super__Rb_tree_header) {
      lVar5 = ((long)(this->data).
                     super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->data).
                     super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    }
    else {
      lVar5 = *(long *)(cVar4._M_node + 2);
    }
    if (lVar5 == ((long)(this->data).
                        super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->data).
                        super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) {
      pmVar6 = (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur == pmVar6) {
        mVar7 = this->currcount;
        pmVar6 = std::
                 map<ICM::Instruction::Instruction,_unsigned_long,_std::less<ICM::Instruction::Instruction>,_std::allocator<std::pair<const_ICM::Instruction::Instruction,_unsigned_long>_>_>
                 ::operator[](map,key);
        *pmVar6 = mVar7;
        mVar7 = this->currcount;
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[](this_00,val);
        *pmVar6 = mVar7;
        local_58._0_4_ = *key;
        pcVar2 = (val->_M_dataplus)._M_p;
        local_50._M_p = (pointer)&local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + val->_M_string_length);
        std::
        vector<std::pair<ICM::Instruction::Instruction,std::__cxx11::string>,std::allocator<std::pair<ICM::Instruction::Instruction,std::__cxx11::string>>>
        ::emplace_back<std::pair<ICM::Instruction::Instruction,std::__cxx11::string>>
                  ((vector<std::pair<ICM::Instruction::Instruction,std::__cxx11::string>,std::allocator<std::pair<ICM::Instruction::Instruction,std::__cxx11::string>>>
                    *)&this->data,
                   (pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_p != &local_40) {
          operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
        }
        mVar7 = this->currcount;
        this->currcount = mVar7 + 1;
      }
      else {
        mVar7 = *pmVar6;
        pmVar6 = std::
                 map<ICM::Instruction::Instruction,_unsigned_long,_std::less<ICM::Instruction::Instruction>,_std::allocator<std::pair<const_ICM::Instruction::Instruction,_unsigned_long>_>_>
                 ::operator[](map,key);
        *pmVar6 = mVar7;
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[](this_00,val);
        *pmVar6 = mVar7;
        local_58._0_4_ = *key;
        pcVar2 = (val->_M_dataplus)._M_p;
        local_50._M_p = (pointer)&local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + val->_M_string_length);
        ppVar1 = (this->data).
                 super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + mVar7;
        ppVar1->first = local_58._0_4_;
        std::__cxx11::string::operator=((string *)&ppVar1->second,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_p != &local_40) {
          operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
        }
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&this->destroyable);
      }
      goto LAB_00126d53;
    }
  }
  mVar7 = ((long)(this->data).
                 super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->data).
                 super__Vector_base<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
LAB_00126d53:
  iVar8.count = mVar7;
  iVar8.data = this;
  return iVar8;
}

Assistant:

iterator insert(const _KTy &key, const _VTy &val) {
		if (findKey(key) != size() || findValue(val) != size()) {
			return end();
		}

		iterator result(this);
		if (destroyable.empty()) {
			keymap[key] = currcount;
			valmap[val] = currcount;
			data.push_back(std::make_pair(key, val));
			result = iterator(this, currcount);
			currcount++;
		}
		else {
			size_t id = destroyable.front();
			keymap[key] = id;
			valmap[val] = id;
			data[id] = std::make_pair(key, val);
			result = iterator(this, id);
			destroyable.pop_front();
		}
		return result;
	}